

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_rsn_hess(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *hessian)

{
  size_t __size;
  int iVar1;
  REF_NODE ref_node;
  uint uVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rsb;
  long center_global;
  REF_CLOUD *ppRVar4;
  long lVar5;
  REF_INT node;
  REF_DBL *pRVar6;
  bool bVar7;
  REF_CLOUD ref_cloud;
  REF_DBL node_hessian [3];
  REF_DBL n [3];
  REF_DBL s [3];
  REF_DBL r [3];
  uint local_dc;
  REF_CLOUD local_d8;
  REF_DBL *local_d0;
  REF_GRID local_c8;
  REF_CLOUD *local_c0;
  REF_CELL local_b8;
  REF_DBL *local_b0;
  REF_DBL local_a8;
  REF_DBL RStack_a0;
  REF_DBL local_98;
  REF_DBL local_88 [4];
  REF_DBL local_68 [4];
  REF_DBL local_48 [3];
  
  ref_node = ref_grid->node;
  local_b8 = ref_grid->cell[3];
  iVar1 = ref_node->max;
  ppRVar4 = (REF_CLOUD *)(long)iVar1;
  local_c8 = ref_grid;
  local_b0 = scalar;
  if ((long)ppRVar4 < 0) {
    bVar7 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x670,
           "ref_recon_rsn_hess","malloc one_layer of REF_CLOUD negative");
    local_dc = 1;
  }
  else {
    __size = (long)ppRVar4 * 8;
    ppRVar4 = (REF_CLOUD *)malloc(__size);
    if (ppRVar4 == (REF_CLOUD *)0x0) {
      bVar7 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x670
             ,"ref_recon_rsn_hess","malloc one_layer of REF_CLOUD NULL");
      local_dc = 2;
      ppRVar4 = (REF_CLOUD *)0x0;
    }
    else {
      bVar7 = true;
      if (iVar1 != 0) {
        memset(ppRVar4,0,__size);
      }
    }
  }
  if (bVar7) {
    local_d0 = hessian;
    local_c0 = ppRVar4;
    if (0 < ref_node->max) {
      lVar5 = 0;
      do {
        if ((-1 < ref_node->global[lVar5]) && (uVar2 = ref_cloud_create(ppRVar4,4), uVar2 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x672,"ref_recon_rsn_hess",(ulong)uVar2,"cloud storage");
          return uVar2;
        }
        lVar5 = lVar5 + 1;
        ppRVar4 = ppRVar4 + 1;
      } while (lVar5 < ref_node->max);
    }
    ppRVar4 = local_c0;
    local_dc = ref_recon_local_immediate_cloud(local_c0,ref_node,local_b8,local_b0);
    if (local_dc == 0) {
      local_dc = ref_recon_ghost_cloud(ppRVar4,ref_node);
      if (local_dc == 0) {
        if (0 < ref_node->max) {
          lVar5 = 0;
          do {
            if ((-1 < ref_node->global[lVar5]) && (ref_node->ref_mpi->id == ref_node->part[lVar5]))
            {
              node = (REF_INT)lVar5;
              uVar2 = ref_recon_rsn(local_c8,node,local_48,local_68,local_88);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x67a,"ref_recon_rsn_hess",(ulong)uVar2,"rsn");
                return uVar2;
              }
              uVar2 = ref_cloud_deep_copy(&local_d8,ppRVar4[lVar5]);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x67c,"ref_recon_rsn_hess",(ulong)uVar2,"create ref_cloud");
                return uVar2;
              }
              pRVar6 = (REF_DBL *)((lVar5 * 0x18 & 0x7fffffff8U) + (long)local_d0);
              uVar2 = 2;
              do {
                uVar3 = ref_recon_grow_cloud_one_layer(local_d8,ppRVar4,ref_node);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x680,"ref_recon_rsn_hess",(ulong)uVar3,"grow");
                  return uVar3;
                }
                center_global = -1;
                if ((lVar5 < ref_node->max) &&
                   (center_global = ref_node->global[lVar5], center_global < 0)) {
                  center_global = -1;
                }
                uVar3 = ref_recon_kexact_rs(center_global,local_d8,local_48,local_68,&local_a8);
                if (4 < uVar2 && uVar3 == 4) {
                  ref_node_location(ref_node,node);
                  printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_DIV_ZERO",
                         (ulong)uVar2);
                }
                if (uVar3 == 8 && 4 < uVar2) {
                  ref_node_location(ref_node,node);
                  printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_ILL_CONDITIONED",
                         (ulong)uVar2);
                }
              } while ((uVar3 != 0) && (bVar7 = uVar2 < 8, uVar2 = uVar2 + 1, bVar7));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x68f,"ref_recon_rsn_hess",(ulong)uVar3,"kexact qr node");
                ref_node_location(ref_node,node);
                return uVar3;
              }
              pRVar6[2] = local_98;
              *pRVar6 = local_a8;
              pRVar6[1] = RStack_a0;
              uVar2 = ref_cloud_free(local_d8);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x693,"ref_recon_rsn_hess",(ulong)uVar2,"free ref_cloud");
                return uVar2;
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < ref_node->max);
        }
        pRVar6 = local_d0;
        if (0 < ref_node->max) {
          lVar5 = 0;
          do {
            if (-1 < ref_node->global[lVar5]) {
              ref_cloud_free(ppRVar4[lVar5]);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < ref_node->max);
        }
        if (ppRVar4 != (REF_CLOUD *)0x0) {
          free(ppRVar4);
        }
        local_dc = ref_node_ghost_dbl(ref_node,pRVar6,3);
        if (local_dc == 0) {
          local_dc = ref_recon_abs_value_hessian2(local_c8,local_d0);
          if (local_dc == 0) {
            local_dc = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x69e,"ref_recon_rsn_hess",(ulong)local_dc,"abs(H)");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x69c,"ref_recon_rsn_hess",(ulong)local_dc,"update ghosts");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x676,"ref_recon_rsn_hess",(ulong)local_dc,"fill ghosts");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x675
             ,"ref_recon_rsn_hess",(ulong)local_dc,"fill immediate cloud");
    }
  }
  return local_dc;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn_hess(REF_GRID ref_grid, REF_DBL *scalar,
                                      REF_DBL *hessian) {
  REF_CLOUD *one_layer;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node, im;
  REF_CLOUD ref_cloud;
  REF_DBL r[3], s[3], n[3];
  REF_DBL node_hessian[3];
  REF_STATUS status;
  REF_INT layer;

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
  }
  RSS(ref_recon_local_immediate_cloud(one_layer, ref_node, ref_cell, scalar),
      "fill immediate cloud");
  RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
      /* use ref_cloud to get a unique list of halo(2) nodes */
      RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]), "create ref_cloud");
      status = REF_INVALID;
      for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
        RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
            "grow");

        status = ref_recon_kexact_rs(ref_node_global(ref_node, node), ref_cloud,
                                     r, s, node_hessian);
        if (REF_DIV_ZERO == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_DIV_ZERO", layer);
        }
        if (REF_ILL_CONDITIONED == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_ILL_CONDITIONED", layer);
        }
      }
      RSB(status, "kexact qr node", { ref_node_location(ref_node, node); });
      for (im = 0; im < 3; im++) {
        hessian[im + 3 * node] = node_hessian[im];
      }
      RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    ref_cloud_free(one_layer[node]); /* no-op for null */
  }
  ref_free(one_layer);

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  RSS(ref_recon_abs_value_hessian2(ref_grid, hessian), "abs(H)");

  return REF_SUCCESS;
}